

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

int Abc_AigSetChoiceLevels(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  undefined4 uVar2;
  long *plVar3;
  long lVar4;
  Abc_Ntk_t *pAVar5;
  int iVar6;
  int *__s;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  int Fill;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  int iVar9;
  long lVar10;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcDfs.c"
                  ,0x707,"int Abc_AigSetChoiceLevels(Abc_Ntk_t *)");
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar9 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar9 + 500;
    iVar6 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar6) {
      __s = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar6;
      in_RDX = extraout_RDX;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar9) {
      memset(__s,0,(uVar1 & 0xffffffff) << 2);
      in_RDX = extraout_RDX_00;
    }
    (pNtk->vTravIds).nSize = iVar6;
  }
  iVar9 = pNtk->nTravIds;
  pNtk->nTravIds = iVar9 + 1;
  if (0x3ffffffe < iVar9) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar8 = pNtk->vCis;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      plVar3 = (long *)pVVar8->pArray[lVar10];
      lVar4 = *plVar3;
      iVar9 = (int)plVar3[2];
      uVar2 = *(undefined4 *)(lVar4 + 0xd8);
      Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar9 + 1,(int)in_RDX);
      if (((long)iVar9 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar9)) goto LAB_001cde43;
      *(undefined4 *)(*(long *)(lVar4 + 0xe8) + (long)iVar9 * 4) = uVar2;
      plVar3[8] = 0;
      lVar10 = lVar10 + 1;
      pVVar8 = pNtk->vCis;
      in_RDX = extraout_RDX_01;
    } while (lVar10 < pVVar8->nSize);
  }
  pAVar7 = Abc_AigConst1(pNtk);
  pAVar5 = pAVar7->pNtk;
  iVar9 = pAVar7->Id;
  iVar6 = pAVar5->nTravIds;
  Vec_IntFillExtra(&pAVar5->vTravIds,iVar9 + 1,Fill);
  if ((-1 < (long)iVar9) && (iVar9 < (pAVar5->vTravIds).nSize)) {
    (pAVar5->vTravIds).pArray[iVar9] = iVar6;
    (pAVar7->field_6).pTemp = (void *)0x0;
    pVVar8 = pNtk->vCos;
    if (pVVar8->nSize < 1) {
      iVar9 = 0;
    }
    else {
      lVar10 = 0;
      iVar9 = 0;
      do {
        iVar6 = Abc_NodeSetChoiceLevel_rec
                          (*(Abc_Obj_t **)
                            (*(long *)(*(long *)(*pVVar8->pArray[lVar10] + 0x20) + 8) +
                            (long)**(int **)((long)pVVar8->pArray[lVar10] + 0x20) * 8),1);
        if (iVar9 <= iVar6) {
          iVar9 = iVar6;
        }
        lVar10 = lVar10 + 1;
        pVVar8 = pNtk->vCos;
      } while (lVar10 < pVVar8->nSize);
    }
    return iVar9;
  }
LAB_001cde43:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

int Abc_AigSetChoiceLevels( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i, LevelMax, LevelCur;
    assert( Abc_NtkIsStrash(pNtk) );
    // set the new travid counter
    Abc_NtkIncrementTravId( pNtk );
    // set levels of the CI and constant
    Abc_NtkForEachCi( pNtk, pObj, i )
    {
        Abc_NodeSetTravIdCurrent( pObj );
        pObj->pCopy = NULL;
    }
    pObj = Abc_AigConst1( pNtk );
    Abc_NodeSetTravIdCurrent( pObj );
    pObj->pCopy = NULL;
    // set levels of all other nodes
    LevelMax = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        LevelCur = Abc_NodeSetChoiceLevel_rec( Abc_ObjFanin0(pObj), 1 );
        LevelMax = Abc_MaxInt( LevelMax, LevelCur );
    }
    return LevelMax;
}